

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::HttpClient::ConnectRequest::Status,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:7243:23)>
::getImpl(SimpleTransformPromiseNode<kj::HttpClient::ConnectRequest::Status,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:7243:23)>
          *this,ExceptionOrValue *output)

{
  AsyncIoStream *pAVar1;
  PromiseArena *pPVar2;
  PromiseArena *pPVar3;
  void *pvVar4;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_450;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_448;
  undefined1 local_440 [8];
  Fault f;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  bool local_400;
  undefined1 local_3f8 [64];
  ExceptionOr<kj::Promise<void>_> local_3b8;
  ExceptionOr<kj::HttpClient::ConnectRequest::Status> depResult;
  
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&depResult.super_ExceptionOrValue);
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_3b8,
               &depResult.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_3b8.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_3b8)
    ;
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_3b8);
  }
  else if (depResult.value.ptr.isSet == true) {
    HttpClient::ConnectRequest::Status::Status
              ((Status *)local_3f8,&depResult.value.ptr.field_1.value);
    _kjCondition.right = 200;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.result = local_3f8._0_4_ == 200;
    _kjCondition.op.content.size_ = 5;
    _kjCondition.left = (uint *)local_3f8;
    if (!_kjCondition.result) {
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x1c4c,FAILED,"status.statusCode == 200","_kjCondition,",&_kjCondition);
      Debug::Fault::fatal(&f);
    }
    local_440 = (undefined1  [8])(local_3f8 + 8);
    f.exception = (Exception *)0x45614d;
    DebugExpression<kj::String&>::operator==
              ((DebugComparison<kj::String_&,_kj::StringPtr> *)&_kjCondition,
               (DebugExpression<kj::String&> *)local_440,(StringPtr *)&f);
    if (local_400 == false) {
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<kj::String&,kj::StringPtr>&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x1c4d,FAILED,"status.statusText == \"OK\"_kj","_kjCondition,",
                 (DebugComparison<kj::String_&,_kj::StringPtr> *)&_kjCondition);
      Debug::Fault::fatal(&f);
    }
    pAVar1 = (this->func).io.ptr;
    (**(pAVar1->super_AsyncOutputStream)._vptr_AsyncOutputStream)
              (&local_450,&pAVar1->super_AsyncOutputStream,"hello",5);
    pPVar2 = (PromiseArena *)(this->func).failed;
    pPVar3 = ((local_450.ptr)->super_PromiseArenaMember).arena;
    if (pPVar3 == (PromiseArena *)0x0 || (ulong)((long)local_450.ptr - (long)pPVar3) < 0x30) {
      pvVar4 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d0);
      TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_450,
                 TransformPromiseNode<void,_kj::_::IdentityFunc<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:7247:42)>
                 ::anon_class_8_1_54ba857b_for_errorHandler::operator());
      *(undefined ***)((long)pvVar4 + 0x3d0) = &PTR_destroy_0058ea00;
      *(PromiseArena **)((long)pvVar4 + 0x3f8) = pPVar2;
      *(void **)((long)pvVar4 + 0x3d8) = pvVar4;
    }
    else {
      ((local_450.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)(local_450.ptr + -3);
      TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_450,
                 TransformPromiseNode<void,_kj::_::IdentityFunc<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:7247:42)>
                 ::anon_class_8_1_54ba857b_for_errorHandler::operator());
      local_450.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_0058ea00;
      local_450.ptr[-1].super_PromiseArenaMember.arena = pPVar2;
      local_450.ptr[-3].super_PromiseArenaMember.arena = pPVar3;
    }
    _kjCondition.left = (uint *)0x0;
    f.exception = (Exception *)0x0;
    local_440 = (undefined1  [8])this_00;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
    Promise<void>::attach<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
              (&local_448.value,(Own<kj::AsyncIoStream,_std::nullptr_t> *)local_440);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_440);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_450);
    HttpClient::ConnectRequest::Status::~Status((Status *)local_3f8);
    local_3b8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_3b8.value.ptr.isSet = true;
    local_3b8.value.ptr.field_1 = local_448;
    local_448 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_3b8)
    ;
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_3b8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_448.value);
  }
  ExceptionOr<kj::HttpClient::ConnectRequest::Status>::~ExceptionOr(&depResult);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }